

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

void Gia_ManHashResize(Gia_Man_t *p)

{
  Vec_Int_t *p_00;
  undefined8 uVar1;
  int iVar2;
  int i;
  int iVar3;
  int iLit0;
  int iLit1;
  int iLitC;
  Gia_Obj_t *pObj;
  int *piVar4;
  int Fill;
  int iVar5;
  Vec_Int_t vOld;
  Vec_Int_t local_48;
  
  uVar1._0_4_ = (p->vHTable).nCap;
  uVar1._4_4_ = (p->vHTable).nSize;
  local_48.pArray = (p->vHTable).pArray;
  local_48._0_8_ = uVar1;
  if (uVar1._4_4_ < 1) {
    __assert_fail("Vec_IntSize(&vOld) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0xaa,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  p_00 = &p->vHTable;
  p_00->nCap = 0;
  p_00->nSize = 0;
  (p->vHTable).pArray = (int *)0x0;
  iVar2 = Gia_ManAndNum(p);
  iVar2 = Abc_PrimeCudd(iVar2 * 2);
  Vec_IntFill(p_00,iVar2,Fill);
  iVar2 = 0;
  iVar5 = 0;
  do {
    if (iVar5 == uVar1._4_4_) {
      iVar5 = Gia_ManAndNum(p);
      if (iVar2 == iVar5 - p->nBufs) {
        Vec_IntErase(&local_48);
        return;
      }
      __assert_fail("Counter == Counter2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                    ,0xbe,"void Gia_ManHashResize(Gia_Man_t *)");
    }
    i = Vec_IntEntry(&local_48,iVar5);
    while( true ) {
      iVar3 = Vec_IntEntry(&p->vHash,i);
      if (i == 0) break;
      pObj = Gia_ManObj(p,i);
      Vec_IntWriteEntry(&p->vHash,i,0);
      iLit0 = Gia_ObjFaninLit0(pObj,i);
      iLit1 = Gia_ObjFaninLit1(pObj,i);
      iLitC = Gia_ObjFaninLit2p(p,pObj);
      piVar4 = Gia_ManHashFind(p,iLit0,iLit1,iLitC);
      if (*piVar4 != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,0xb8,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      *piVar4 = i;
      iVar2 = iVar2 + 1;
      i = iVar3;
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Gia_ManHashResize( Gia_Man_t * p )
{
    int i, iThis, iNext, Counter, Counter2, * pPlace;
    Vec_Int_t vOld = p->vHTable;
    assert( Vec_IntSize(&vOld) > 0 );
    // replace the table
    Vec_IntZero( &p->vHTable );
    Vec_IntFill( &p->vHTable, Abc_PrimeCudd( 2 * Gia_ManAndNum(p) ), 0 ); 
    // rehash the entries from the old table
    Counter = 0;
    Vec_IntForEachEntry( &vOld, iThis, i )
        for ( iNext = Vec_IntEntry(&p->vHash, iThis);  
              iThis;  iThis = iNext,   
              iNext = Vec_IntEntry(&p->vHash, iThis)  )
        {
            Gia_Obj_t * pThis0 = Gia_ManObj( p, iThis );
            Vec_IntWriteEntry( &p->vHash, iThis, 0 );
            pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pThis0, iThis), Gia_ObjFaninLit1(pThis0, iThis), Gia_ObjFaninLit2p(p, pThis0) );
            assert( *pPlace == 0 ); // should not be there
            *pPlace = iThis;
            assert( *pPlace != 0 );
            Counter++;
        }
    Counter2 = Gia_ManAndNum(p) - Gia_ManBufNum(p);
    assert( Counter == Counter2 );
//    if ( p->fVerbose )
//        printf( "Resizing GIA hash table: %d -> %d.\n", Vec_IntSize(&vOld), Vec_IntSize(&p->vHTable) );
    Vec_IntErase( &vOld );
}